

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O2

void __thiscall
BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
::copy_tree(BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
            *this,BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                  *other)

{
  ulong uVar1;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  **ppBVar2;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *pBVar3;
  ulong index;
  
  b_array::copy_array<MultiMap::Pair<std::__cxx11::string,long>>
            (&other->data,&this->data,other->data_size,&this->data_size);
  this->duplicates_allowed = other->duplicates_allowed;
  uVar1 = other->subset_size;
  this->subset_size = uVar1;
  for (index = 0; index < uVar1; index = index + 1) {
    ppBVar2 = b_array::
              Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
              ::operator[](&other->subset,index);
    if (*ppBVar2 !=
        (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
         *)0x0) {
      pBVar3 = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)operator_new(0x40);
      BPlusTree(pBVar3,other->duplicates_allowed);
      ppBVar2 = b_array::
                Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                ::operator[](&this->subset,index);
      *ppBVar2 = pBVar3;
      ppBVar2 = b_array::
                Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                ::operator[](&this->subset,index);
      pBVar3 = *ppBVar2;
      ppBVar2 = b_array::
                Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                ::operator[](&other->subset,index);
      copy_tree(pBVar3,*ppBVar2);
    }
    uVar1 = other->subset_size;
  }
  return;
}

Assistant:

void BPlusTree<T>::copy_tree(const BPlusTree<T>& other) {
    // copy data
    b_array::copy_array(other.data, data, other.data_size, data_size);
    duplicates_allowed = other.duplicates_allowed;
    subset_size = other.subset_size;
    for (size_t i = 0; i < other.subset_size; ++i) {
        if (other.subset[i] != nullptr) {
            subset[i] = new BPlusTree<T>(other.duplicates_allowed);
            subset[i]->copy_tree(*(other.subset[i]));
        }
    }
}